

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  NeuralNetworkLayer *pNVar3;
  bool bVar4;
  long lVar5;
  LayerUnion LVar6;
  long *plVar7;
  size_type *psVar8;
  WeightParams *pWVar9;
  LSTMParams *pLVar10;
  LSTMWeightParams *pLVar11;
  long lVar12;
  InternalMetadataWithArenaLite *pIVar13;
  uint64_t expectedUnits;
  bool bVar14;
  Result r;
  string err;
  UniDirectionalLSTMLayerParams recurrent;
  _func_int **local_170;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  string local_148;
  string local_128;
  Result *local_108;
  uint64_t local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [24];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  LSTMParams *local_a8;
  LSTMWeightParams *local_a0;
  uint64 local_98;
  uint64_t local_90;
  uint64_t local_80;
  NeuralNetworkLayer *local_78;
  string local_70;
  LSTMParams local_50;
  
  Result::Result((Result *)&local_170);
  validateInputCount((Result *)local_d0,layer,1,3);
  local_170 = (_func_int **)local_d0;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT44(local_b8._M_allocated_capacity._4_4_,
                             local_b8._M_allocated_capacity._0_4_) + 1);
  }
  bVar4 = Result::good((Result *)&local_170);
  if (bVar4) {
    validateOutputCount((Result *)local_d0,layer,3,3);
    local_170 = (_func_int **)local_d0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT44(local_b8._M_allocated_capacity._4_4_,
                               local_b8._M_allocated_capacity._0_4_) + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_170);
  if ((bVar4) && (bVar4 = Result::good((Result *)&local_170), bVar4)) {
    if (this->ndArrayInterpretation == true) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UniDirectionalLSTM","");
      validateInputOutputRankEquality((Result *)local_d0,layer,&local_70,&this->blobNameToRank);
      local_170 = (_func_int **)local_d0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,
                        CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                 local_b8._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good((Result *)&local_170);
      if (bVar4) {
        local_f8 = (undefined1  [8])local_e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"UniDirectionalLSTM","");
        validateRankCount((Result *)local_d0,layer,(string *)local_f8,5,5,&this->blobNameToRank);
        local_170 = (_func_int **)local_d0;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                   local_b8._M_allocated_capacity._0_4_) + 1);
        }
        if (local_f8 != (undefined1  [8])local_e8) {
          operator_delete((void *)local_f8,local_e8._0_8_ + 1);
        }
        bVar4 = Result::good((Result *)&local_170);
        if (bVar4) goto LAB_002d3cc4;
      }
    }
    else {
LAB_002d3cc4:
      local_108 = __return_storage_ptr__;
      local_78 = layer;
      if (layer->_oneof_case_[0] == 0x1a4) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance()
        ;
      }
      pIVar13 = &(LVar6.batchnorm_)->mean_->_internal_metadata_;
      if ((LVar6.batchnorm_)->mean_ == (WeightParams *)0x0) {
        pIVar13 = (InternalMetadataWithArenaLite *)0x0;
      }
      lVar5 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                     &(LVar6.convolution_)->kernelsize_)->super_RepeatedPtrFieldBase).current_size_;
      if (lVar5 != 0) {
        lVar12 = 0;
        do {
          validateRecurrentActivationParams
                    ((Result *)local_d0,
                     *(ActivationParams **)
                      ((long)&(pIVar13->
                              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                              ).ptr_ + lVar12));
          local_170 = (_func_int **)local_d0;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_p != &local_b8) {
            operator_delete(local_c8._M_p,
                            CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                     local_b8._M_allocated_capacity._0_4_) + 1);
          }
          bVar4 = Result::good((Result *)&local_170);
          bVar14 = lVar5 * 8 + -8 != lVar12;
          lVar12 = lVar12 + 8;
        } while (bVar4 && bVar14);
      }
      pNVar3 = local_78;
      if (local_78->_oneof_case_[0] == 0x1a4) {
        LVar6 = local_78->layer_;
      }
      else {
        LVar6.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance()
        ;
      }
      __return_storage_ptr__ = local_108;
      pLVar11 = (LVar6.unidirectionallstm_)->weightparams_;
      if (pLVar11 == (LSTMWeightParams *)0x0) {
        pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
      }
      if (pNVar3->_oneof_case_[0] == 0x1a4) {
        LVar6 = pNVar3->layer_;
      }
      else {
        LVar6.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance()
        ;
      }
      pLVar10 = (LVar6.unidirectionallstm_)->params_;
      if (pLVar10 == (LSTMParams *)0x0) {
        pLVar10 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
      }
      Specification::LSTMParams::LSTMParams(&local_50,pLVar10);
      validateLSTMWeightParams((Result *)local_d0,pLVar11,&local_50);
      local_170 = (_func_int **)local_d0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,
                        CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                 local_b8._M_allocated_capacity._0_4_) + 1);
      }
      Specification::LSTMParams::~LSTMParams(&local_50);
      bVar4 = Result::good((Result *)&local_170);
      if (bVar4) {
        if (pNVar3->_oneof_case_[0] == 0x1a4) {
          LVar6 = pNVar3->layer_;
        }
        else {
          LVar6.unidirectionallstm_ =
               Specification::UniDirectionalLSTMLayerParams::default_instance();
        }
        Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
                  ((UniDirectionalLSTMLayerParams *)local_d0,LVar6.unidirectionallstm_);
        if (local_b8._M_allocated_capacity._0_4_ == 3) {
          pLVar11 = local_a0;
          if (local_a0 == (LSTMWeightParams *)0x0) {
            pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
          }
          local_100 = local_90;
          pWVar9 = pLVar11->inputgateweightmatrix_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          expectedUnits = local_98 * local_90;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"Unidirectional LSTM","");
          psVar2 = (pNVar3->name_).ptr_;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"input gate weight matrix","");
          validateGeneralWeightParams
                    ((Result *)local_f8,pWVar9,expectedUnits,local_100,&local_148,psVar2,&local_128)
          ;
          local_170 = (_func_int **)local_f8;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
          if (local_f0._M_p != local_e8 + 8) {
            operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good((Result *)&local_170);
          if (bVar4) {
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->forgetgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"forget gate weight matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,expectedUnits,local_100,&local_148,psVar2,
                       &local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->blockinputweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"block input gate weight matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,expectedUnits,local_100,&local_148,psVar2,
                       &local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->outputgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"output gate weight matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,expectedUnits,local_100,&local_148,psVar2,
                       &local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->inputgaterecursionmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"input gate recursion matrix","");
            local_80 = local_100 * local_100;
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,local_80,local_100,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->forgetgaterecursionmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"forget gate recursion matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,local_80,local_100,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->blockinputrecursionmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"block input gate recursion matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,local_80,local_100,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar11 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar9 = pLVar11->outputgaterecursionmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"output gate recursion matrix","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar9,local_80,local_100,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            paVar1 = &local_148.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (!bVar4) goto LAB_002d5063;
            pLVar10 = local_a8;
            if (local_a8 == (LSTMParams *)0x0) {
              pLVar10 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
            }
            if (pLVar10->hasbiasvectors_ == true) {
              pLVar11 = local_a0;
              if (local_a0 == (LSTMWeightParams *)0x0) {
                pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
              }
              pWVar9 = pLVar11->inputgatebiasvector_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_148._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_148,"Unidirectional LSTM","");
              psVar2 = (pNVar3->name_).ptr_;
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,"input gate bias vector","");
              validateGeneralWeightParams
                        ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
              local_170 = (_func_int **)local_f8;
              std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
              if (local_f0._M_p != local_e8 + 8) {
                operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != paVar1) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good((Result *)&local_170);
              if (bVar4) {
                pLVar11 = local_a0;
                if (local_a0 == (LSTMWeightParams *)0x0) {
                  pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
                }
                pWVar9 = pLVar11->forgetgatebiasvector_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_148._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_148,"Unidirectional LSTM","");
                psVar2 = (pNVar3->name_).ptr_;
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_128,"forget gate bias vector","");
                validateGeneralWeightParams
                          ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                local_170 = (_func_int **)local_f8;
                std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                if (local_f0._M_p != local_e8 + 8) {
                  operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  operator_delete(local_128._M_dataplus._M_p,
                                  local_128.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != paVar1) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  local_148.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good((Result *)&local_170);
                if (bVar4) {
                  pLVar11 = local_a0;
                  if (local_a0 == (LSTMWeightParams *)0x0) {
                    pLVar11 = (LSTMWeightParams *)
                              &Specification::_LSTMWeightParams_default_instance_;
                  }
                  pWVar9 = pLVar11->blockinputbiasvector_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_148._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_148,"Unidirectional LSTM","");
                  psVar2 = (pNVar3->name_).ptr_;
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_128,"block input bias vector","");
                  validateGeneralWeightParams
                            ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                  local_170 = (_func_int **)local_f8;
                  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                  if (local_f0._M_p != local_e8 + 8) {
                    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    local_128.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_dataplus._M_p != paVar1) {
                    operator_delete(local_148._M_dataplus._M_p,
                                    local_148.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good((Result *)&local_170);
                  if (bVar4) {
                    pLVar11 = local_a0;
                    if (local_a0 == (LSTMWeightParams *)0x0) {
                      pLVar11 = (LSTMWeightParams *)
                                &Specification::_LSTMWeightParams_default_instance_;
                    }
                    pWVar9 = pLVar11->outputgatebiasvector_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    local_148._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_148,"Unidirectional LSTM","");
                    psVar2 = (pNVar3->name_).ptr_;
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_128,"output gate bias vector","");
                    validateGeneralWeightParams
                              ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                    local_170 = (_func_int **)local_f8;
                    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                    if (local_f0._M_p != local_e8 + 8) {
                      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != paVar1) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good((Result *)&local_170);
                    if (bVar4) goto LAB_002d4c7e;
                  }
                }
              }
            }
            else {
LAB_002d4c7e:
              if (local_a8 == (LSTMParams *)0x0) {
                local_a8 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
              }
              if (local_a8->haspeepholevectors_ == true) {
                pLVar11 = local_a0;
                if (local_a0 == (LSTMWeightParams *)0x0) {
                  pLVar11 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
                }
                pWVar9 = pLVar11->inputgatepeepholevector_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_148._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_148,"Unidirectional LSTM","");
                psVar2 = (pNVar3->name_).ptr_;
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_128,"input gate peep hole vector","");
                validateGeneralWeightParams
                          ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                local_170 = (_func_int **)local_f8;
                std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                if (local_f0._M_p != local_e8 + 8) {
                  operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  operator_delete(local_128._M_dataplus._M_p,
                                  local_128.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != paVar1) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  local_148.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good((Result *)&local_170);
                if (bVar4) {
                  pLVar11 = local_a0;
                  if (local_a0 == (LSTMWeightParams *)0x0) {
                    pLVar11 = (LSTMWeightParams *)
                              &Specification::_LSTMWeightParams_default_instance_;
                  }
                  pWVar9 = pLVar11->forgetgatepeepholevector_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_148._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_148,"Unidirectional LSTM","");
                  psVar2 = (pNVar3->name_).ptr_;
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_128,"forget gate peep hole vector","");
                  validateGeneralWeightParams
                            ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                  local_170 = (_func_int **)local_f8;
                  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                  if (local_f0._M_p != local_e8 + 8) {
                    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    local_128.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_dataplus._M_p != paVar1) {
                    operator_delete(local_148._M_dataplus._M_p,
                                    local_148.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good((Result *)&local_170);
                  if (bVar4) {
                    if (local_a0 == (LSTMWeightParams *)0x0) {
                      local_a0 = (LSTMWeightParams *)
                                 &Specification::_LSTMWeightParams_default_instance_;
                    }
                    pWVar9 = local_a0->outputgatepeepholevector_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    local_148._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_148,"Unidirectional LSTM","");
                    psVar2 = (pNVar3->name_).ptr_;
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_128,"output gate peep hole vector","");
                    validateGeneralWeightParams
                              ((Result *)local_f8,pWVar9,local_100,1,&local_148,psVar2,&local_128);
                    local_170 = (_func_int **)local_f8;
                    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
                    if (local_f0._M_p != local_e8 + 8) {
                      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != paVar1) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    Result::good((Result *)&local_170);
                  }
                }
              }
            }
            *(_func_int ***)local_108 = local_170;
            paVar1 = &(local_108->m_message).field_2;
            (local_108->m_message)._M_dataplus._M_p = (pointer)paVar1;
            __return_storage_ptr__ = local_108;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_p == &local_158) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
              *(undefined8 *)((long)&(local_108->m_message).field_2 + 8) = local_158._8_8_;
            }
            else {
              (local_108->m_message)._M_dataplus._M_p = local_168._M_p;
              (local_108->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
            }
          }
          else {
LAB_002d5063:
            *(_func_int ***)__return_storage_ptr__ = local_170;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_p == &local_158) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                   local_158._8_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
            }
          }
          local_168._M_p = (pointer)&local_158;
          (__return_storage_ptr__->m_message)._M_string_length = local_160;
          local_160 = 0;
          local_158._M_local_buf[0] = '\0';
        }
        else {
          std::operator+(&local_148,"Unidirectional LSTM layer:",(pNVar3->name_).ptr_);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar8) {
            local_e8._0_8_ = *psVar8;
            local_e8._8_8_ = plVar7[3];
            local_f8 = (undefined1  [8])local_e8;
          }
          else {
            local_e8._0_8_ = *psVar8;
            local_f8 = (undefined1  [8])*plVar7;
          }
          local_f0._M_p = (pointer)plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
          if (local_f8 != (undefined1  [8])local_e8) {
            operator_delete((void *)local_f8,local_e8._0_8_ + 1);
          }
        }
        Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
                  ((UniDirectionalLSTMLayerParams *)local_d0);
        goto LAB_002d3edc;
      }
    }
  }
  *(_func_int ***)__return_storage_ptr__ = local_170;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_160;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
LAB_002d3edc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 3);
    if (r.good()) {
        r = validateOutputCount(layer, 3, 3);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "output gate weight matrix");
    if(!r.good()) return r;
    // Check recursion matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "output gate recursion matrix");
    if(!r.good()) return r;
    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate peep hole vector");
        if(!r.good()) return r;
    }

    return r;
}